

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IColourImpl * Catch::anon_unknown_22::platformColourInstance(void)

{
  uint uVar1;
  int iVar2;
  IContext *pIVar3;
  type tVar4;
  IConfig *pIVar5;
  Ptr<const_Catch::IConfig> config;
  IColourImpl *local_48;
  Ptr<const_Catch::IConfig> local_8;
  
  pIVar3 = getCurrentContext();
  (*pIVar3->_vptr_IContext[6])();
  tVar4 = Catch::Ptr::operator_cast_to_function_pointer((Ptr<const_Catch::IConfig> *)0x17b9d9);
  if (tVar4 == 0) {
LAB_0017ba1d:
    iVar2 = isatty(1);
    if (iVar2 == 0) {
      local_48 = NoColourImpl::instance();
      goto LAB_0017ba4e;
    }
  }
  else {
    pIVar5 = Ptr<const_Catch::IConfig>::operator->(&local_8);
    uVar1 = (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])();
    if ((uVar1 & 1) == 0) goto LAB_0017ba1d;
  }
  local_48 = PosixColourImpl::instance();
LAB_0017ba4e:
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)local_48);
  return local_48;
}

Assistant:

IColourImpl* platformColourInstance() {
        Ptr<IConfig const> config = getCurrentContext().getConfig();
        return (config && config->forceColour()) || isatty(STDOUT_FILENO)
            ? PosixColourImpl::instance()
            : NoColourImpl::instance();
    }